

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  size_type sVar1;
  pointer pcVar2;
  string *psVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  size_type sVar5;
  ostringstream os;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = txt->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (txt->_M_dataplus)._M_p;
    sVar5 = 0;
    uVar4 = extraout_RDX;
    do {
      transformed_abi_cxx11_(&local_1d0,(lest *)(ulong)(uint)(int)pcVar2[sVar5],(char)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      uVar4 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
        uVar4 = extraout_RDX_01;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  std::__cxx11::ostringstream::str();
  psVar3 = local_1b0;
  (local_1b0->_M_dataplus)._M_p = (pointer)&local_1b0->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
    (local_1b0->field_2)._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&local_1b0->field_2 + 8) = local_1d0.field_2._8_8_;
  }
  else {
    (local_1b0->_M_dataplus)._M_p = local_1d0._M_dataplus._M_p;
    (local_1b0->field_2)._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
  }
  local_1b0->_M_string_length = local_1d0._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

inline std::string make_tran_string( std::string const & txt ) { std::ostringstream os; for(auto c:txt) os << transformed(c); return os.str(); }